

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multilabel_oaa.cc
# Opt level: O2

void predict_or_learn<true>(multi_oaa *o,single_learner *base,example *ec)

{
  wclass *pwVar1;
  wclass *pwVar2;
  ostream *poVar3;
  ulong uVar4;
  ulong uVar5;
  labels preds;
  float local_8c;
  wclass *local_88;
  polyprediction *local_80;
  wclass *local_78;
  wclass **local_70;
  v_array<unsigned_int> local_68;
  wclass *local_48;
  size_t sStack_40;
  
  pwVar1 = (ec->l).cs.costs._begin;
  pwVar2 = (ec->l).cs.costs._end;
  local_70 = &(ec->l).cs.costs.end_array;
  local_48 = (ec->l).cs.costs.end_array;
  sStack_40 = (ec->l).cs.costs.erase_count;
  local_80 = &ec->pred;
  local_68._begin = (uint *)(ec->pred).scalars._begin;
  local_68._end = (uint *)(ec->pred).scalars._end;
  local_68.end_array = (uint *)(ec->pred).scalars.end_array;
  local_68.erase_count = (ec->pred).scalars.erase_count;
  v_array<unsigned_int>::clear(&local_68);
  (ec->l).cs.costs._begin = (wclass *)0x3f8000007f7fffff;
  (ec->l).simple.initial = 0.0;
  uVar4 = (long)pwVar2 - (long)pwVar1 >> 2;
  local_8c = 0.0;
  uVar5 = 0;
  local_88 = pwVar1;
  local_78 = pwVar2;
  while( true ) {
    if (o->k <= (ulong)(uint)local_8c) break;
    (ec->l).multi.label = 0xbf800000;
    if ((uVar5 < uVar4) && ((&local_88->x)[uVar5] == local_8c)) {
      (ec->l).multi.label = 0x3f800000;
      uVar5 = (ulong)((int)uVar5 + 1);
    }
    LEARNER::learner<char,_example>::learn(base,ec,(ulong)(uint)local_8c);
    if (0.0 < (ec->pred).scalar) {
      v_array<unsigned_int>::push_back(&local_68,(uint *)&local_8c);
    }
    local_8c = (float)((int)local_8c + 1);
  }
  if (uVar5 < uVar4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"label ");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," is not in {0,");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3,"} This won\'t work right.");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  (local_80->scalars).end_array = (float *)local_68.end_array;
  (local_80->scalars).erase_count = local_68.erase_count;
  (local_80->scalars)._begin = (float *)local_68._begin;
  (local_80->scalars)._end = (float *)local_68._end;
  (ec->l).cs.costs._begin = local_88;
  (ec->l).cs.costs._end = local_78;
  *local_70 = local_48;
  local_70[1] = (wclass *)sStack_40;
  return;
}

Assistant:

void predict_or_learn(multi_oaa& o, LEARNER::single_learner& base, example& ec)
{
  MULTILABEL::labels multilabels = ec.l.multilabels;
  MULTILABEL::labels preds = ec.pred.multilabels;
  preds.label_v.clear();

  ec.l.simple = {FLT_MAX, 1.f, 0.f};
  uint32_t multilabel_index = 0;
  for (uint32_t i = 0; i < o.k; i++)
  {
    if (is_learn)
    {
      ec.l.simple.label = -1.f;
      if (multilabels.label_v.size() > multilabel_index && multilabels.label_v[multilabel_index] == i)
      {
        ec.l.simple.label = 1.f;
        multilabel_index++;
      }
      base.learn(ec, i);
    }
    else
      base.predict(ec, i);
    if (ec.pred.scalar > 0.)
      preds.label_v.push_back(i);
  }
  if (is_learn && multilabel_index < multilabels.label_v.size())
    cout << "label " << multilabels.label_v[multilabel_index] << " is not in {0," << o.k - 1
         << "} This won't work right." << endl;

  ec.pred.multilabels = preds;
  ec.l.multilabels = multilabels;
}